

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Mat4 *matrixArray,size_t length)

{
  GLfloat *pGVar1;
  size_t sVar2;
  long lVar3;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  UniformBinder UStack_58;
  vector<float,_std::allocator<float>_> local_48;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&local_48,length << 4,(allocator_type *)&UStack_58);
  if (length != 0) {
    lVar3 = 0;
    sVar2 = length;
    do {
      priv::copyMatrix((float *)((long)matrixArray->array + lVar3),0x10,
                       (float *)((long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar3));
      lVar3 = lVar3 + 0x40;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  UniformBinder::UniformBinder(&UStack_58,this,name);
  if (UStack_58.location != -1) {
    pGVar1 = (GLfloat *)0x0;
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pGVar1 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    (*sf_glad_glUniformMatrix4fvARB)(UStack_58.location,(GLsizei)length,'\0',pGVar1);
  }
  UniformBinder::~UniformBinder(&UStack_58);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Mat4* matrixArray, std::size_t length)
{
    const std::size_t matrixSize = 4 * 4;

    std::vector<float> contiguous(matrixSize * length);
    for (std::size_t i = 0; i < length; ++i)
        priv::copyMatrix(matrixArray[i].array, matrixSize, &contiguous[matrixSize * i]);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniformMatrix4fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, !contiguous.empty() ? &contiguous[0] : NULL));
}